

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode curl_multi_perform(Curl_multi *multi,int *running_handles)

{
  CURLMcode CVar1;
  CURLMcode CVar2;
  Curl_tree *pCVar3;
  Curl_easy *data;
  curltime now_00;
  curltime cVar4;
  curltime now;
  Curl_tree *t;
  
  cVar4 = Curl_now();
  now.tv_sec = cVar4.tv_sec;
  now.tv_usec = cVar4.tv_usec;
  CVar2 = CURLM_BAD_HANDLE;
  if ((multi != (Curl_multi *)0x0) && (multi->magic == 0xbab1e)) {
    if (multi->in_callback == false) {
      CVar2 = CURLM_OK;
      for (data = multi->easyp; data != (Curl_easy *)0x0; data = data->next) {
        sigpipe_ignore(data,(sigpipe_ignore *)&t);
        CVar1 = multi_runsingle(multi,&now,data);
        sigpipe_restore((sigpipe_ignore *)&t);
        if (CVar1 != CURLM_OK) {
          CVar2 = CVar1;
        }
      }
      do {
        cVar4.tv_usec = now.tv_usec;
        cVar4.tv_sec = now.tv_sec;
        cVar4._12_4_ = 0;
        pCVar3 = Curl_splaygetbest(cVar4,multi->timetree,&t);
        multi->timetree = pCVar3;
        if (t == (Curl_tree *)0x0) break;
        now_00.tv_usec = now.tv_usec;
        now_00.tv_sec = now.tv_sec;
        now_00._12_4_ = 0;
        add_next_timeout(now_00,multi,(Curl_easy *)t->payload);
      } while (t != (Curl_tree *)0x0);
      *running_handles = multi->num_alive;
      if (CVar2 < CURLM_BAD_HANDLE) {
        CVar2 = Curl_update_timer(multi);
      }
    }
    else {
      CVar2 = CURLM_RECURSIVE_API_CALL;
    }
  }
  return CVar2;
}

Assistant:

CURLMcode curl_multi_perform(struct Curl_multi *multi, int *running_handles)
{
  struct Curl_easy *data;
  CURLMcode returncode = CURLM_OK;
  struct Curl_tree *t;
  struct curltime now = Curl_now();

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  data = multi->easyp;
  while(data) {
    CURLMcode result;
    SIGPIPE_VARIABLE(pipe_st);

    sigpipe_ignore(data, &pipe_st);
    result = multi_runsingle(multi, &now, data);
    sigpipe_restore(&pipe_st);

    if(result)
      returncode = result;

    data = data->next; /* operate on next handle */
  }

  /*
   * Simply remove all expired timers from the splay since handles are dealt
   * with unconditionally by this function and curl_multi_timeout() requires
   * that already passed/handled expire times are removed from the splay.
   *
   * It is important that the 'now' value is set at the entry of this function
   * and not for the current time as it may have ticked a little while since
   * then and then we risk this loop to remove timers that actually have not
   * been handled!
   */
  do {
    multi->timetree = Curl_splaygetbest(now, multi->timetree, &t);
    if(t)
      /* the removed may have another timeout in queue */
      (void)add_next_timeout(now, multi, t->payload);

  } while(t);

  *running_handles = multi->num_alive;

  if(CURLM_OK >= returncode)
    returncode = Curl_update_timer(multi);

  return returncode;
}